

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

Scalar __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_max_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *this_00;
  CoeffReturnType plVar1;
  CoeffReturnType pfVar2;
  Index IVar3;
  Index idx;
  Index i;
  Scalar m;
  IndicesType *idxs;
  RowVectorType *v_local;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  this_00 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)
            PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
  plVar1 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()(this_00,this->_Np);
  pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,*plVar1);
  i._4_4_ = *pfVar2;
  idx = this->_Np;
  while( true ) {
    idx = idx + 1;
    IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    if (IVar3 <= idx) break;
    plVar1 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()(this_00,idx);
    IVar3 = *plVar1;
    pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,IVar3);
    if (i._4_4_ < *pfVar2) {
      pfVar2 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)v,IVar3);
      i._4_4_ = *pfVar2;
    }
  }
  return i._4_4_;
}

Assistant:

Scalar _max_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Scalar m = v(idxs(_Np));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx);}
    }
    return m;
  }